

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementEffects.cpp
# Opt level: O0

void __thiscall Rml::ElementEffects::ReleaseEffects(ElementEffects *this)

{
  vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
  *this_00;
  bool bVar1;
  const_iterator ppvVar2;
  reference this_01;
  element_type *peVar3;
  DecoratorEntry *decorator;
  iterator __end2;
  iterator __begin2;
  DecoratorEntryList *__range2;
  DecoratorEntryList *list;
  const_iterator __end1;
  const_iterator __begin1;
  DecoratorEntryList *local_30;
  initializer_list<std::vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>_*>
  local_28;
  initializer_list<std::vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>_*>
  *local_18;
  initializer_list<std::vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>_*>
  *__range1;
  ElementEffects *this_local;
  
  __begin1 = (const_iterator)&this->decorators;
  local_30 = &this->mask_images;
  local_28._M_array = (iterator)&__begin1;
  local_28._M_len = 2;
  local_18 = &local_28;
  __range1 = (initializer_list<std::vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>_*>
              *)this;
  __end1 = ::std::
           initializer_list<std::vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>_*>
           ::begin(local_18);
  ppvVar2 = ::std::
            initializer_list<std::vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>_*>
            ::end(local_18);
  for (; __end1 != ppvVar2; __end1 = __end1 + 1) {
    this_00 = *__end1;
    __end2 = ::std::
             vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
             ::begin(this_00);
    decorator = (DecoratorEntry *)
                ::std::
                vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
                ::end(this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<Rml::ElementEffects::DecoratorEntry_*,_std::vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>_>
                                  *)&decorator);
      if (!bVar1) break;
      this_01 = __gnu_cxx::
                __normal_iterator<Rml::ElementEffects::DecoratorEntry_*,_std::vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>_>
                ::operator*(&__end2);
      if (this_01->decorator_data != 0) {
        peVar3 = ::std::
                 __shared_ptr_access<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this_01);
        (*peVar3->_vptr_Decorator[3])(peVar3,this_01->decorator_data);
      }
      __gnu_cxx::
      __normal_iterator<Rml::ElementEffects::DecoratorEntry_*,_std::vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>_>
      ::operator++(&__end2);
    }
    ::std::
    vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
    ::clear(this_00);
  }
  ::std::vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
  ::clear(&this->filters);
  ::std::vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
  ::clear(&this->backdrop_filters);
  return;
}

Assistant:

void ElementEffects::ReleaseEffects()
{
	for (DecoratorEntryList* list : {&decorators, &mask_images})
	{
		for (DecoratorEntry& decorator : *list)
		{
			if (decorator.decorator_data)
				decorator.decorator->ReleaseElementData(decorator.decorator_data);
		}
		list->clear();
	}

	filters.clear();
	backdrop_filters.clear();
}